

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thdat08.c
# Opt level: O1

int th08_open(thdat_t *thdat,thtk_error_t **error)

{
  off_t oVar1;
  off_t oVar2;
  ssize_t sVar3;
  uchar *data;
  thtk_io_t *input;
  char *pcVar4;
  ulong uVar5;
  size_t sVar6;
  thdat_entry_t *ptVar7;
  size_t sVar8;
  thdat_entry_t *ptVar9;
  thdat_entry_t *ptVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  th08_archive_header_t header;
  int local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  thtk_io_t *local_40;
  char *local_38;
  ulong __size;
  
  oVar1 = thtk_io_seek(thdat->stream,0,2,error);
  iVar11 = 0;
  if (oVar1 != -1) {
    oVar2 = thtk_io_seek(thdat->stream,0,0,error);
    iVar11 = 0;
    if (oVar2 != -1) {
      sVar3 = thtk_io_read(thdat->stream,&local_50,0x10,error);
      if (sVar3 == -1) {
        iVar11 = 0;
      }
      else if (local_50 == 0x5a474250) {
        th_decrypt((uchar *)&local_4c,0xc,'\x1b','7',0xc,0x400);
        local_4c = local_4c - 0x1e240;
        local_48 = local_48 - 0x5464e;
        local_44 = local_44 - 0x8aa53;
        iVar12 = 0;
        oVar2 = thtk_io_seek(thdat->stream,(ulong)local_48,0,error);
        iVar11 = 0;
        if (oVar2 != -1) {
          uVar13 = (int)oVar1 - local_48;
          __size = (ulong)uVar13;
          data = (uchar *)malloc(__size);
          sVar3 = thtk_io_read(thdat->stream,data,__size,error);
          if (sVar3 != -1) {
            th_decrypt(data,uVar13,'>',0x9b,0x80,0x400);
            input = thtk_io_open_memory(data,__size,error);
            iVar11 = iVar12;
            if (input != (thtk_io_t *)0x0) {
              local_40 = thtk_io_open_growing_memory(error);
              if (local_40 != (thtk_io_t *)0x0) {
                sVar3 = th_unlzss(input,local_40,(ulong)local_44,error);
                if (sVar3 != -1) {
                  thtk_io_close(input);
                  pcVar4 = (char *)malloc((ulong)local_44);
                  oVar2 = thtk_io_seek(local_40,0,0,error);
                  iVar11 = 0;
                  if (oVar2 != -1) {
                    uVar5 = thtk_io_read(local_40,pcVar4,(ulong)local_44,error);
                    iVar11 = 0;
                    if (uVar5 == local_44) {
                      local_38 = pcVar4;
                      thtk_io_close(local_40);
                      if (local_4c != 0) {
                        uVar13 = 0;
                        pcVar4 = local_38;
                        do {
                          sVar6 = thdat->entry_count + 1;
                          thdat->entry_count = sVar6;
                          ptVar7 = (thdat_entry_t *)realloc(thdat->entries,sVar6 * 0x120);
                          thdat->entries = ptVar7;
                          sVar6 = thdat->entry_count;
                          ptVar10 = ptVar7 + (sVar6 - 1);
                          thdat_entry_init(ptVar10);
                          strcpy(ptVar10->name,pcVar4);
                          sVar8 = strlen(ptVar10->name);
                          ptVar7[sVar6 - 1].offset = (ulong)*(uint *)(pcVar4 + sVar8 + 1);
                          ptVar7[sVar6 - 1].size = (ulong)*(uint *)(pcVar4 + sVar8 + 5);
                          ptVar7[sVar6 - 1].extra = *(uint32_t *)(pcVar4 + sVar8 + 9);
                          uVar13 = uVar13 + 1;
                          pcVar4 = pcVar4 + sVar8 + 0xd;
                        } while (uVar13 < local_4c);
                      }
                      if (local_4c != 0) {
                        uVar5 = (ulong)local_4c;
                        ptVar7 = thdat->entries;
                        ptVar10 = (thdat_entry_t *)0x0;
                        do {
                          ptVar9 = ptVar7;
                          if (ptVar10 != (thdat_entry_t *)0x0) {
                            ptVar10->zsize = ptVar9->offset - ptVar10->offset;
                          }
                          uVar5 = uVar5 - 1;
                          ptVar7 = ptVar9 + 1;
                          ptVar10 = ptVar9;
                        } while (uVar5 != 0);
                        ptVar9->zsize = oVar1 - (__size + ptVar9->offset);
                      }
                      free(local_38);
                      iVar11 = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        thtk_error_func_new(error,"th08_open","magic not PBGZ");
        iVar11 = 0;
      }
    }
  }
  return iVar11;
}

Assistant:

static int
th08_open(
    thdat_t* thdat,
    thtk_error_t** error)
{
    unsigned char* data;
    unsigned char* zdata;
    off_t filesize = thtk_io_seek(thdat->stream, 0, SEEK_END, error);
    if (filesize == -1)
        return 0;
    if (thtk_io_seek(thdat->stream, 0, SEEK_SET, error) == -1)
        return 0;

    th08_archive_header_t header;

    if (thtk_io_read(thdat->stream, &header, sizeof(header), error) == -1)
        return 0;

    if (strncmp(header.magic, "PBGZ", 4)) {
        thtk_error_new(error, "magic not PBGZ");
        return 0;
    }

    th_decrypt((unsigned char*)&header + 4, sizeof(header) - 4, 0x1b, 0x37, sizeof(header) - 4, 0x400);

    header.count -= 123456;
    header.offset -= 345678;
    header.size -= 567891;

    if (thtk_io_seek(thdat->stream, header.offset, SEEK_SET, error) == -1)
        return 0;

    unsigned int zsize = filesize - header.offset;
    zdata = malloc(zsize);

    if (thtk_io_read(thdat->stream, zdata, zsize, error) == -1)
        return 0;

    th_decrypt(zdata, zsize, 0x3e, 0x9b, 0x80, 0x400);

    thtk_io_t* compressed_data = thtk_io_open_memory(zdata, zsize, error);
    if (!compressed_data)
        return 0;
    thtk_io_t* raw_data = thtk_io_open_growing_memory(error);
    if (!raw_data)
        return 0;
    if (th_unlzss(compressed_data, raw_data, header.size, error) == -1)
        return 0;

    thtk_io_close(compressed_data);

    data = malloc(header.size);
    if (thtk_io_seek(raw_data, 0, SEEK_SET, error) == -1)
        return 0;
    if (thtk_io_read(raw_data, data, header.size, error) != header.size)
        return 0;
    thtk_io_close(raw_data);

    const uint32_t* ptr = (uint32_t*)data;
    for (unsigned int i = 0; i < header.count; ++i) {
        thdat_entry_t* entry;
        ARRAY_GROW(thdat->entry_count, thdat->entries, entry);
        thdat_entry_init(entry);

        strcpy(entry->name, (char*)ptr);
        ptr = (uint32_t*)((char*)ptr + strlen(entry->name) + 1);
        entry->offset = *ptr++;
        entry->size = *ptr++;
        entry->extra = *ptr++;
    }

    if (header.count) {
        thdat_entry_t* prev = NULL;
        for (unsigned int i = 0; i < header.count; ++i) {
            thdat_entry_t* entry = &thdat->entries[i];
            if (prev)
                prev->zsize = entry->offset - prev->offset;
            prev = entry;
        }
        prev->zsize = (filesize - zsize) - prev->offset;
    }

    free(data);

    return 1;
}